

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Put64(int g_a,int64_t *lo,int64_t *hi,void *buf,int64_t *ld)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int i_2;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  int local_104;
  int iVar1;
  int iVar2;
  void *in_stack_ffffffffffffff08;
  Integer *in_stack_ffffffffffffff10;
  Integer *in_stack_ffffffffffffff18;
  Integer in_stack_ffffffffffffff20;
  long local_b8 [8];
  long local_78 [8];
  long local_38;
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_30 = (long)in_EDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = pnga_ndim((Integer)hi);
  for (iVar2 = 0; iVar2 < local_38; iVar2 = iVar2 + 1) {
    local_78[(local_38 - iVar2) + -1] = *(long *)(local_10 + (long)iVar2 * 8) + 1;
  }
  for (iVar1 = 0; iVar1 < local_38; iVar1 = iVar1 + 1) {
    local_b8[(local_38 - iVar1) + -1] = *(long *)(local_18 + (long)iVar1 * 8) + 1;
  }
  for (local_104 = 0; (long)local_104 < local_38 + -1; local_104 = local_104 + 1) {
    *(undefined8 *)(&stack0xffffffffffffff08 + ((local_38 - local_104) + -2) * 8) =
         *(undefined8 *)(local_28 + (long)local_104 * 8);
  }
  pnga_put(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
           in_stack_ffffffffffffff08,(Integer *)CONCAT44(iVar2,iVar1));
  return;
}

Assistant:

void NGA_Put64(int g_a, int64_t lo[], int64_t hi[], void* buf, int64_t ld[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_put(a, _ga_lo, _ga_hi, buf, _ga_work);
}